

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.h
# Opt level: O0

void __thiscall
cfd::core::AddressFormatData::AddressFormatData(AddressFormatData *this,AddressFormatData *param_2)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffe8;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

class CFD_CORE_EXPORT AddressFormatData {
 public:
  /**
   * @brief constructor.
   */
  AddressFormatData();
  /**
   * @brief constructor.
   * @param[in] default_format_name     default format name
   */
  explicit AddressFormatData(const std::string& default_format_name);
  /**
   * @brief constructor.
   * @param[in] map_data     prefix setting map
   */
  explicit AddressFormatData(
      const std::map<std::string, std::string>& map_data);

  /**
   * @brief Get string value.
   * @param[in] key   mapping key
   * @return value
   */
  std::string GetString(const std::string& key) const;
  /**
   * @brief Get numeric value from string.
   * @param[in] key   mapping key
   * @return uint32_t value
   */
  uint32_t GetValue(const std::string& key) const;

  /**
   * @brief Get P2pkh prefix.
   * @return P2pkh prefix
   */
  uint8_t GetP2pkhPrefix() const;
  /**
   * @brief Get P2sh prefix.
   * @return P2sh prefix
   */
  uint8_t GetP2shPrefix() const;
  /**
   * @brief Get hrp on bech32.
   * @return Bech32 hrp
   */
  std::string GetBech32Hrp() const;
  /**
   * @brief Get network type.
   * @return network type
   */
  NetType GetNetType() const;

  /**
   * @brief Get Address format data from json string.
   * @param[in] json_data       json string
   * @return Address format data
   */
  static AddressFormatData ConvertFromJson(const std::string& json_data);
  /**
   * @brief Get Address format data list from json string.
   * @param[in] json_data       json string
   * @return Address format data list
   */
  static std::vector<AddressFormatData> ConvertListFromJson(
      const std::string& json_data);

 private:
  std::map<std::string, std::string> map_;  //!< map
}